

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void nite::graphicsRender(void)

{
  RenderFunction p_Var1;
  uint64_t uVar2;
  size_type sVar3;
  reference ppRVar4;
  int local_18;
  int local_14;
  int c_2;
  int c_1;
  int i;
  int c;
  
  uVar2 = getTicks();
  currentDelta = uVar2 - initDelta;
  initDelta = getTicks();
  glClear(0x4000);
  glClearColor(0x3f451eb8,0x3f451eb8,0x3f451eb8,0x3f800000);
  for (c_1 = 0; c_1 < 0xc; c_1 = c_1 + 1) {
    sVar3 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::size
                      (&targets[c_1].objects);
    if (sVar3 != 0) {
      (*__glewBindFramebuffer)(0x8ca9,targets[c_1].objectId);
      setupTarget();
      for (c_2 = 0; sVar3 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::
                            size(&targets[c_1].objects), (ulong)(long)c_2 < sVar3; c_2 = c_2 + 1) {
        ppRVar4 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::operator[]
                            (&targets[c_1].objects,(long)c_2);
        p_Var1 = (*ppRVar4)->function;
        ppRVar4 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::operator[]
                            (&targets[c_1].objects,(long)c_2);
        (*p_Var1)(*ppRVar4);
      }
    }
  }
  (*__glewBindFramebuffer)(0x8ca9,0);
  glClear();
  glClearColor(0x3f800000,0x3f800000,0x3f800000);
  for (local_14 = 0; local_14 < 0xc; local_14 = local_14 + 1) {
    sVar3 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::size
                      (&targets[local_14].objects);
    if (sVar3 != 0) {
      drawTarget(targets + local_14);
    }
  }
  for (local_18 = 0; local_18 < 0xc; local_18 = local_18 + 1) {
    sVar3 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::size
                      (&targets[local_18].objects);
    if (sVar3 != 0) {
      RenderTarget::clear(targets + local_18);
    }
  }
  setDepth(0);
  flushTexture();
  flushFont();
  SDL_GL_SwapWindow(Window);
  Console::render();
  UI::render();
  return;
}

Assistant:

void nite::graphicsRender(){

  	currentDelta = nite::getTicks() - initDelta;
	initDelta = nite::getTicks();

	if(cl_showfps){
		// UInt64 time = nite::getTicks()-lastFrameTick;
		// lastFrameTick = nite::getTicks();
		// String text = "delta "+nite::toStr((size_t)time)+" ms";
		// int w = debugFont.getWidth("delta 1000 ms");
		// nite::setRenderTarget(nite::RenderTargetPosterioriEngine);
		// nite::setColor(time < 16 ? nite::Color(1.0f, 0.0f, 0.0f, 1.0f) : nite::Color(0.0f, 1.0f, 0.0f, 1.0f));
		// debugFont.draw(text, nite::getWidth()-w * 2.0f, 0.0f + debugFont.getHeight());
	}

	glClear(GL_COLOR_BUFFER_BIT);
	glClearColor(0.77, 0.77, 0.77, 1.0);
	for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, targets[c].objectId);
		setupTarget();
		for(int i = 0; i < targets[c].objects.size(); ++i){
			targets[c].objects[i]->function(targets[c].objects[i]);
		}
	}
	glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);

	glClear(GL_COLOR_BUFFER_BIT);
	glClearColor (1, 1, 1, 1);

	for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		drawTarget(targets[c]);
	}

	for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		targets[c].clear();
	}

	nite::setDepth(0);
	flushTexture();
	flushFont();
	SDL_GL_SwapWindow(Window);

	nite::Console::render();
	nite::UI::render();	
}